

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

bool __thiscall
QAbstractItemViewPrivate::dropOn
          (QAbstractItemViewPrivate *this,QDropEvent *event,int *dropRow,int *dropCol,
          QModelIndex *dropIndex)

{
  long *plVar1;
  undefined1 auVar2 [16];
  char cVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  DropIndicatorPosition DVar7;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  QModelIndex local_98;
  QPointF local_78;
  QPoint local_60;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (event[0xc] == (QDropEvent)0x0) {
    plVar1 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                        super_QWidgetPrivate.field_0x8;
    local_58.r = -1;
    local_58.c = -1;
    local_58.i = 0;
    local_58.m.ptr = (QAbstractItemModel *)0x0;
    local_98._0_16_ = QWidget::rect((this->super_QAbstractScrollAreaPrivate).viewport);
    local_78.xp = *(qreal *)(event + 0x10);
    local_78.yp = *(qreal *)(event + 0x18);
    local_60 = QPointF::toPoint(&local_78);
    cVar3 = QRect::contains((QPoint *)&local_98,SUB81(&local_60,0));
    if (cVar3 != '\0') {
      local_98._0_16_ = *(QRect *)(event + 0x10);
      local_78.xp = (qreal)QPointF::toPoint((QPointF *)&local_98);
      (**(code **)(*plVar1 + 0x1f0))(&local_58,plVar1);
      if (((local_58.r < 0) || ((long)local_58._0_8_ < 0)) ||
         (local_58.m.ptr == (QAbstractItemModel *)0x0)) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_98,&this->root);
        local_58.m.ptr = local_98.m.ptr;
        local_58._0_8_ = local_98._0_8_;
        local_58.i = local_98.i;
      }
    }
    uVar6 = (**(code **)(*(long *)this->model + 0xe8))();
    if ((*(uint *)(event + 0x2c) & uVar6) != 0) {
      bVar4 = ::operator!=(&local_58,&this->root);
      if (bVar4) {
        local_98._0_16_ = *(QRect *)(event + 0x10);
        local_60 = QPointF::toPoint((QPointF *)&local_98);
        local_78 = (QPointF)(**(code **)(*plVar1 + 0x1e0))(plVar1,&local_58);
        DVar7 = (**(code **)(*(long *)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                       super_QWidgetPrivate + 0x120))
                          (this,&local_60,&local_78,&local_58);
        this->dropIndicatorPosition = DVar7;
        iVar8 = local_58.c;
        if (DVar7 == BelowItem) {
          iVar9 = local_58.r + 1;
        }
        else {
          iVar9 = local_58.r;
          if (DVar7 != AboveItem) goto LAB_004e46df;
        }
        QModelIndex::parent(&local_98,&local_58);
        auVar2 = (undefined1  [16])local_98._0_16_;
        local_58.m.ptr = local_98.m.ptr;
        local_58.r = local_98.r;
        local_58.c = local_98.c;
        local_58.i = local_98.i;
        local_98._0_16_ = auVar2;
      }
      else {
        this->dropIndicatorPosition = OnViewport;
LAB_004e46df:
        iVar8 = -1;
        iVar9 = iVar8;
      }
      (dropIndex->m).ptr = local_58.m.ptr;
      dropIndex->r = local_58.r;
      dropIndex->c = local_58.c;
      dropIndex->i = local_58.i;
      *dropRow = iVar9;
      *dropCol = iVar8;
      bVar4 = droppingOnItself(this,event,&local_58);
      bVar5 = true;
      if (!bVar4) goto LAB_004e474d;
    }
  }
  bVar5 = false;
LAB_004e474d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QAbstractItemViewPrivate::dropOn(QDropEvent *event, int *dropRow, int *dropCol, QModelIndex *dropIndex)
{
    Q_Q(QAbstractItemView);
    if (event->isAccepted())
        return false;

    QModelIndex index;
    // rootIndex() (i.e. the viewport) might be a valid index
    if (viewport->rect().contains(event->position().toPoint())) {
        index = q->indexAt(event->position().toPoint());
        if (!index.isValid())
            index = root;
    }

    // If we are allowed to do the drop
    if (model->supportedDropActions() & event->dropAction()) {
        int row = -1;
        int col = -1;
        if (index != root) {
            dropIndicatorPosition = position(event->position().toPoint(), q->visualRect(index), index);
            switch (dropIndicatorPosition) {
            case QAbstractItemView::AboveItem:
                row = index.row();
                col = index.column();
                index = index.parent();
                break;
            case QAbstractItemView::BelowItem:
                row = index.row() + 1;
                col = index.column();
                index = index.parent();
                break;
            case QAbstractItemView::OnItem:
            case QAbstractItemView::OnViewport:
                break;
            }
        } else {
            dropIndicatorPosition = QAbstractItemView::OnViewport;
        }
        *dropIndex = index;
        *dropRow = row;
        *dropCol = col;
        if (!droppingOnItself(event, index))
            return true;
    }
    return false;
}